

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::_find_key<int>(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                 *this,int *key,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  __m128i match;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  char cVar12;
  char cVar14;
  char cVar15;
  char cVar16;
  
  if (this->ctrl_ != (ctrl_t *)0x0) {
    uVar2 = this->capacity_;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar9 = hashval >> 7;
    auVar10 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar10 = pshuflw(auVar10,auVar10,0);
    lVar8 = 0;
    while( true ) {
      uVar9 = uVar9 & uVar2;
      pcVar1 = this->ctrl_ + uVar9;
      cVar5 = pcVar1[0xf];
      cVar12 = auVar10[0];
      auVar13[0] = -(cVar12 == *pcVar1);
      cVar14 = auVar10[1];
      auVar13[1] = -(cVar14 == pcVar1[1]);
      cVar15 = auVar10[2];
      auVar13[2] = -(cVar15 == pcVar1[2]);
      cVar16 = auVar10[3];
      auVar13[3] = -(cVar16 == pcVar1[3]);
      auVar13[4] = -(cVar12 == pcVar1[4]);
      auVar13[5] = -(cVar14 == pcVar1[5]);
      auVar13[6] = -(cVar15 == pcVar1[6]);
      auVar13[7] = -(cVar16 == pcVar1[7]);
      auVar13[8] = -(cVar12 == pcVar1[8]);
      auVar13[9] = -(cVar14 == pcVar1[9]);
      auVar13[10] = -(cVar15 == pcVar1[10]);
      auVar13[0xb] = -(cVar16 == pcVar1[0xb]);
      auVar13[0xc] = -(cVar12 == pcVar1[0xc]);
      auVar13[0xd] = -(cVar14 == pcVar1[0xd]);
      auVar13[0xe] = -(cVar15 == pcVar1[0xe]);
      auVar13[0xf] = -(cVar16 == cVar5);
      uVar4 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf;
      if (uVar4 != 0) {
        uVar6 = (uint)uVar4;
        do {
          uVar3 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar7 = uVar3 + uVar9 & uVar2;
          if (this->slots_[uVar7] == *key) {
            return uVar7;
          }
          uVar6 = uVar6 - 1 & uVar6;
        } while (uVar6 != 0);
      }
      auVar11[0] = -(*pcVar1 == -0x80);
      auVar11[1] = -(pcVar1[1] == -0x80);
      auVar11[2] = -(pcVar1[2] == -0x80);
      auVar11[3] = -(pcVar1[3] == -0x80);
      auVar11[4] = -(pcVar1[4] == -0x80);
      auVar11[5] = -(pcVar1[5] == -0x80);
      auVar11[6] = -(pcVar1[6] == -0x80);
      auVar11[7] = -(pcVar1[7] == -0x80);
      auVar11[8] = -(pcVar1[8] == -0x80);
      auVar11[9] = -(pcVar1[9] == -0x80);
      auVar11[10] = -(pcVar1[10] == -0x80);
      auVar11[0xb] = -(pcVar1[0xb] == -0x80);
      auVar11[0xc] = -(pcVar1[0xc] == -0x80);
      auVar11[0xd] = -(pcVar1[0xd] == -0x80);
      auVar11[0xe] = -(pcVar1[0xe] == -0x80);
      auVar11[0xf] = -(cVar5 == -0x80);
      if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar11 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar11 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar11 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar11 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar11 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar11 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar11 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar11 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar11 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar11 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar11 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar11 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar5 == -0x80)
      break;
      uVar9 = uVar9 + lVar8 + 0x10;
      lVar8 = lVar8 + 0x10;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }